

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

int __thiscall CTcTokenizer::find_include_once(CTcTokenizer *this,char *fname)

{
  int iVar1;
  tctok_incfile_t *ptVar2;
  
  ptVar2 = (tctok_incfile_t *)&this->prev_includes_;
  do {
    ptVar2 = ptVar2->nxt;
    if (ptVar2 == (tctok_incfile_t *)0x0) {
      return 0;
    }
    iVar1 = os_file_names_equal(fname,ptVar2->fname);
  } while (iVar1 == 0);
  return 1;
}

Assistant:

int CTcTokenizer::find_include_once(const char *fname)
{
    tctok_incfile_t *prvinc;

    /* search the list */
    for (prvinc = prev_includes_ ; prvinc != 0 ; prvinc = prvinc->nxt)
    {
        /* if this one matches, we found it, so return true */
        if (os_file_names_equal(fname, prvinc->fname))
            return TRUE;
    }

    /* we didn't find the file */
    return FALSE;
}